

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.cpp
# Opt level: O2

void __thiscall
StackArgWithFormalsTracker::SetStackSymInFormalsIndexMap
          (StackArgWithFormalsTracker *this,StackSym *sym,ArgSlot formalsIndex,ArgSlot formalsCount)

{
  code *pcVar1;
  bool bVar2;
  StackSym **ppSVar3;
  undefined4 *puVar4;
  
  ppSVar3 = this->formalsIndexToStackSymMap;
  if (ppSVar3 == (StackSym **)0x0) {
    ppSVar3 = Memory::AllocateArray<Memory::JitArenaAllocator,StackSym*,false>
                        ((Memory *)this->alloc,
                         (JitArenaAllocator *)Memory::JitArenaAllocator::AllocZero,0,
                         (ulong)formalsCount);
    this->formalsIndexToStackSymMap = ppSVar3;
  }
  if (formalsCount <= formalsIndex) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                       ,0x760,"(formalsIndex < formalsCount)","Out of range ?");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
    ppSVar3 = this->formalsIndexToStackSymMap;
  }
  ppSVar3[formalsIndex] = sym;
  return;
}

Assistant:

void
StackArgWithFormalsTracker::SetStackSymInFormalsIndexMap(StackSym * sym, Js::ArgSlot formalsIndex, Js::ArgSlot formalsCount)
{
    if(formalsIndexToStackSymMap == nullptr)
    {
        formalsIndexToStackSymMap = JitAnewArrayZ(alloc, StackSym*, formalsCount);
    }
    AssertMsg(formalsIndex < formalsCount, "Out of range ?");
    formalsIndexToStackSymMap[formalsIndex] = sym;
}